

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

ClassType *
slang::ast::Lookup::findClass
          (NameSyntax *className,ASTContext *context,optional<slang::DiagCode> requireInterfaceClass
          )

{
  string_view *psVar1;
  undefined8 uVar2;
  bool bVar3;
  Diagnostic *pDVar4;
  Type *pTVar5;
  EVP_PKEY_CTX *ctx;
  ClassType *pCVar6;
  SourceRange SVar7;
  LookupResult result;
  undefined1 local_278 [328];
  SmallVectorBase<slang::Diagnostic> local_130;
  
  local_278._0_8_ = (Type *)0x0;
  local_278._8_5_ = 0;
  local_278._13_3_ = 0;
  local_278._16_4_ = 0;
  local_278[0x14] = 0;
  local_278._32_8_ = 0;
  local_278._40_8_ = 4;
  local_278._248_8_ = 0;
  local_278._256_8_ = 2;
  local_130.data_ = (pointer)(local_278 + 0x160);
  local_130.len = 0;
  local_130.cap = 2;
  local_278._24_8_ = local_278 + 0x30;
  local_278._240_8_ = local_278 + 0x108;
  name(className,context,(bitmask<slang::ast::LookupFlags>)0x81,(LookupResult *)local_278);
  ctx = (EVP_PKEY_CTX *)(local_278 + 0x148);
  Compilation::addDiagnostics(((context->scope).ptr)->compilation,(Diagnostics *)ctx);
  if ((Type *)local_278._0_8_ != (Type *)0x0) {
    if (((uint6)requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0) {
LAB_002d886e:
      bVar3 = Symbol::isType((Symbol *)local_278._0_8_);
      uVar2 = local_278._0_8_;
      if (bVar3) {
        pTVar5 = *(Type **)(local_278._0_8_ + 0x40);
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical((Type *)local_278._0_8_);
          pTVar5 = *(Type **)(uVar2 + 0x40);
        }
        uVar2 = local_278._0_8_;
        if ((pTVar5->super_Symbol).kind == ClassType) {
          pCVar6 = *(ClassType **)(local_278._0_8_ + 0x40);
          if (pCVar6 == (ClassType *)0x0) {
            Type::resolveCanonical((Type *)local_278._0_8_);
            pCVar6 = *(ClassType **)(uVar2 + 0x40);
          }
          if ((((uint6)requireInterfaceClass.super__Optional_base<slang::DiagCode,_true,_true>.
                       _M_payload.super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0)
             || (pCVar6->isInterface != false)) goto LAB_002d89b3;
          SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
          pDVar4 = ASTContext::addDiag(context,requireInterfaceClass.
                                               super__Optional_base<slang::DiagCode,_true,_true>.
                                               _M_payload.
                                               super__Optional_payload_base<slang::DiagCode>.
                                               _M_payload._M_value,SVar7);
          psVar1 = &(pCVar6->super_Type).super_Symbol.name;
          ctx = (EVP_PKEY_CTX *)psVar1->_M_len;
          Diagnostic::operator<<(pDVar4,*psVar1);
          goto LAB_002d89b0;
        }
      }
      bVar3 = Symbol::isType((Symbol *)local_278._0_8_);
      uVar2 = local_278._0_8_;
      if (bVar3) {
        pTVar5 = *(Type **)(local_278._0_8_ + 0x40);
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical((Type *)local_278._0_8_);
          pTVar5 = *(Type **)(uVar2 + 0x40);
        }
        if ((pTVar5->super_Symbol).kind == ErrorType) goto LAB_002d89b0;
      }
      SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
      pDVar4 = ASTContext::addDiag(context,(DiagCode)0x1e000a,SVar7);
      psVar1 = &((Symbol *)local_278._0_8_)->name;
      ctx = (EVP_PKEY_CTX *)psVar1->_M_len;
      Diagnostic::operator<<(pDVar4,*psVar1);
    }
    else {
      if ((local_278[0x14] & 8) == 0) {
        if ((local_278[0x14] & 0x10) == 0) goto LAB_002d886e;
        SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
        ctx = (EVP_PKEY_CTX *)0xc000a;
      }
      else {
        SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)className);
        ctx = (EVP_PKEY_CTX *)0xd000a;
      }
      ASTContext::addDiag(context,SUB84(ctx,0),SVar7);
    }
  }
LAB_002d89b0:
  pCVar6 = (ClassType *)0x0;
LAB_002d89b3:
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)(local_278 + 0x148),ctx);
  if ((undefined1 *)local_278._240_8_ != local_278 + 0x108) {
    operator_delete((void *)local_278._240_8_);
  }
  if ((undefined1 *)local_278._24_8_ != local_278 + 0x30) {
    operator_delete((void *)local_278._24_8_);
  }
  return pCVar6;
}

Assistant:

const ClassType* Lookup::findClass(const NameSyntax& className, const ASTContext& context,
                                   std::optional<DiagCode> requireInterfaceClass) {
    LookupResult result;
    Lookup::name(className, context, LookupFlags::Type | LookupFlags::NoSelectors, result);
    result.reportDiags(context);
    if (!result.found)
        return nullptr;

    if (requireInterfaceClass) {
        if (result.flags.has(LookupResultFlags::FromTypeParam)) {
            context.addDiag(diag::IfaceExtendTypeParam, className.sourceRange());
            return nullptr;
        }

        if (result.flags.has(LookupResultFlags::FromForwardTypedef)) {
            context.addDiag(diag::IfaceExtendIncomplete, className.sourceRange());
            return nullptr;
        }
    }

    if (!result.found->isType() || !result.found->as<Type>().isClass()) {
        if (!result.found->isType() || !result.found->as<Type>().isError())
            context.addDiag(diag::NotAClass, className.sourceRange()) << result.found->name;
        return nullptr;
    }

    auto& classType = result.found->as<Type>().getCanonicalType().as<ClassType>();

    if (requireInterfaceClass && !classType.isInterface) {
        context.addDiag(*requireInterfaceClass, className.sourceRange()) << classType.name;
        return nullptr;
    }

    return &classType;
}